

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * getPathWithoutFinalSlash(char *aoDestination,char *aSource)

{
  char *local_20;
  char *lTmp;
  char *aSource_local;
  char *aoDestination_local;
  
  if (aSource == (char *)0x0) {
    *aoDestination = '\0';
  }
  else {
    local_20 = strrchr(aSource,0x2f);
    if (local_20 == (char *)0x0) {
      local_20 = strrchr(aSource,0x5c);
    }
    if (local_20 == (char *)0x0) {
      *aoDestination = '\0';
    }
    else {
      strncpy(aoDestination,aSource,(long)local_20 - (long)aSource);
      aoDestination[(long)local_20 - (long)aSource] = '\0';
    }
  }
  return aoDestination;
}

Assistant:

static char * getPathWithoutFinalSlash(
        char * const aoDestination, /* make sure it is allocated, use _MAX_PATH */
        char const * const aSource) /* aoDestination and aSource can be the same */
{
        char const * lTmp ;
        if ( aSource )
        {
                lTmp = strrchr(aSource, '/');
                if (!lTmp)
                {
                        lTmp = strrchr(aSource, '\\');
                }
                if (lTmp)
                {
                        strncpy(aoDestination, aSource, lTmp - aSource );
                        aoDestination[lTmp - aSource] = '\0';
                }
                else
                {
                        * aoDestination = '\0';
                }
        }
        else
        {
                * aoDestination = '\0';
        }
        return aoDestination;
}